

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O2

NamedPoint * helics::helicsGetNamedPoint(string_view val)

{
  int iVar1;
  char *in_RSI;
  NamedPoint *in_RDI;
  double dVar2;
  string_view jsonString;
  json json;
  allocator<char> local_51;
  data local_50;
  string local_40;
  
  (in_RDI->name)._M_dataplus._M_p = (pointer)&(in_RDI->name).field_2;
  (in_RDI->name)._M_string_length = 0;
  (in_RDI->name).field_2._M_local_buf[0] = '\0';
  in_RDI->value = NAN;
  jsonString._M_str = in_RSI;
  jsonString._M_len = (size_t)&local_50;
  fileops::loadJsonStr_abi_cxx11_(jsonString);
  switch(local_50.m_type) {
  case object:
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"value",&local_51);
    fileops::replaceIfMember((json *)&local_50,&local_40,&in_RDI->value);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"name",&local_51);
    fileops::replaceIfMember((json *)&local_50,(string *)&local_40,(string *)in_RDI);
    break;
  default:
    goto switchD_001e5e25_caseD_2;
  case string:
    nlohmann::json_abi_v3_11_3::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
    ::get_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              (&local_40,
               (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                *)&local_50);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&in_RDI->name,&local_40);
    break;
  case number_integer:
  case number_unsigned:
    iVar1 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::get_impl<int,_0>((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&local_50);
    dVar2 = (double)iVar1;
    goto LAB_001e5ea3;
  case number_float:
    dVar2 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::get_impl<double,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_50);
LAB_001e5ea3:
    in_RDI->value = dVar2;
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&in_RDI->name,"value");
    goto switchD_001e5e25_caseD_2;
  }
  std::__cxx11::string::~string((string *)&local_40);
switchD_001e5e25_caseD_2:
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&local_50);
  return in_RDI;
}

Assistant:

NamedPoint helicsGetNamedPoint(std::string_view val)
{
    NamedPoint namePoint;
    try {
        auto json = fileops::loadJsonStr(val);
        switch (json.type()) {
            case nlohmann::json::value_t::number_float:
                namePoint.value = json.get<double>();
                namePoint.name = "value";
                break;
            case nlohmann::json::value_t::string:
                namePoint.name = json.get<std::string>();
                break;
            case nlohmann::json::value_t::array:
                break;
            case nlohmann::json::value_t::number_integer:
            case nlohmann::json::value_t::number_unsigned:
                namePoint.value = static_cast<double>(json.get<int>());
                namePoint.name = "value";
                break;
            case nlohmann::json::value_t::object:
                fileops::replaceIfMember(json, "value", namePoint.value);
                fileops::replaceIfMember(json, "name", namePoint.name);
                break;
            default:
                break;
        }
    }
    catch (...) {
        namePoint.name = val;
    }
    return namePoint;
}